

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O0

string * CLI::detail::trim_copy(string *str)

{
  string *psVar1;
  string *in_RSI;
  string *in_RDI;
  string s;
  string local_30 [48];
  
  ::std::__cxx11::string::string(local_30,in_RSI);
  psVar1 = trim((string *)0x130539);
  ::std::__cxx11::string::string((string *)in_RDI,(string *)psVar1);
  ::std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

inline std::string trim_copy(const std::string &str) {
    std::string s = str;
    return trim(s);
}